

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadlist.cpp
# Opt level: O2

int __thiscall Quadlist::clear(Quadlist *this)

{
  int iVar1;
  int iVar2;
  undefined1 auStack_48 [40];
  
  iVar1 = this->_size;
  iVar2 = iVar1;
  while (0 < iVar2) {
    remove((Quadlist *)auStack_48,(char *)this);
    std::__cxx11::string::~string((string *)(auStack_48 + 8));
    iVar2 = this->_size;
  }
  return iVar1;
}

Assistant:

int Quadlist::clear() {
    int old_size =_size;
    while (0<_size) remove(header->succ);
    return old_size;
}